

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall
DyndepParserTestUnexpectedEqual::~DyndepParserTestUnexpectedEqual
          (DyndepParserTestUnexpectedEqual *this)

{
  DyndepParserTestUnexpectedEqual *this_local;
  
  ~DyndepParserTestUnexpectedEqual(this);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(DyndepParserTest, UnexpectedEqual) {
  const char kInput[] =
"= 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unexpected '='\n", err);
}